

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

size_t PHF::uniq<unsigned_long>(unsigned_long *k,size_t n)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  qsort(k,n,8,Uniq::cmp<unsigned_long>);
  lVar1 = 0;
  for (uVar3 = 1; uVar3 < n; uVar3 = uVar3 + 1) {
    if (k[uVar3] != k[lVar1]) {
      k[lVar1 + 1] = k[uVar3];
      lVar1 = lVar1 + 1;
    }
  }
  sVar2 = lVar1 + 1;
  if (n == 0) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}